

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::Generator::StdGrammarStackElement>::Parse
          (Parse<SGParser::Generator::StdGrammarStackElement> *this,ParseTable *ptable,
          size_t stackSize)

{
  size_t stackSize_local;
  ParseTable *ptable_local;
  Parse<SGParser::Generator::StdGrammarStackElement> *this_local;
  
  this->pParseTable = (ParseTable *)0x0;
  this->pTokenizer = (TokenStream<SGParser::Generator::StdGrammarToken> *)0x0;
  BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::BacktrackingTokenStream
            (&this->Stream);
  this->StackPosition = 0;
  this->StackSize = 0;
  this->pStack = (StdGrammarStackElement *)0x0;
  this->TopState = 0xffffffff;
  this->NextTokenFlag = false;
  this->PrevTokenIndex = 0xffffffffffffffff;
  Generator::StdGrammarToken::StdGrammarToken(&this->Token);
  this->ReduceLeft = 0;
  this->pValidTokenStackPositions = (size_t *)0x0;
  this->ErrorMarker = 0xffffffffffffffff;
  this->LastErrorState = 0xffffffff;
  std::__cxx11::string::string((string *)&this->ErrorStackStr);
  Create(this,ptable,stackSize);
  return;
}

Assistant:

explicit Parse(const ParseTable* ptable = nullptr, size_t stackSize = DefaultStackSize) {
        Create(ptable, stackSize);
    }